

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<tinyusdz::Payload> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  bool triple_deliminated;
  Payload v;
  bool local_151;
  Payload local_150;
  
  bVar5 = MaybeNone(this);
  if (bVar5) {
    if (value->has_value_ == true) {
      nonstd::optional_lite::detail::storage_t<tinyusdz::Payload>::destruct_value
                ((storage_t<tinyusdz::Payload> *)&value->contained);
    }
    value->has_value_ = false;
    bVar5 = true;
  }
  else {
    local_150.asset_path.asset_path_._M_dataplus._M_p =
         (pointer)&local_150.asset_path.asset_path_.field_2;
    local_150.asset_path.asset_path_._M_string_length = 0;
    local_150.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
    local_150.asset_path.resolved_path_._M_dataplus._M_p =
         (pointer)&local_150.asset_path.resolved_path_.field_2;
    local_150.asset_path.resolved_path_._M_string_length = 0;
    local_150.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
    local_150.prim_path._prim_part._M_dataplus._M_p =
         (pointer)&local_150.prim_path._prim_part.field_2;
    local_150.prim_path._prim_part._M_string_length = 0;
    local_150.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
    local_150.prim_path._prop_part._M_dataplus._M_p =
         (pointer)&local_150.prim_path._prop_part.field_2;
    local_150.prim_path._prop_part._M_string_length = 0;
    local_150.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_150.prim_path._variant_part.field_2;
    local_150.prim_path._variant_part._M_string_length = 0;
    local_150.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_150.prim_path._variant_selection_part.field_2;
    local_150.prim_path._variant_selection_part._M_string_length = 0;
    local_150.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
    paVar3 = &local_150.prim_path._variant_part_str.field_2;
    local_150.prim_path._variant_part_str._M_string_length = 0;
    local_150.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
    paVar4 = &local_150.prim_path._element.field_2;
    local_150.prim_path._element._M_string_length = 0;
    local_150.prim_path._element.field_2._M_local_buf[0] = '\0';
    local_150.prim_path._path_type.has_value_ = false;
    local_150.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_150.prim_path._valid = false;
    local_150.layerOffset._offset = 0.0;
    local_150.layerOffset._scale = 1.0;
    local_150.prim_path._variant_part._M_dataplus._M_p = (pointer)paVar1;
    local_150.prim_path._variant_selection_part._M_dataplus._M_p = (pointer)paVar2;
    local_150.prim_path._variant_part_str._M_dataplus._M_p = (pointer)paVar3;
    local_150.prim_path._element._M_dataplus._M_p = (pointer)paVar4;
    bVar5 = ParsePayload(this,&local_150,&local_151);
    if (bVar5) {
      nonstd::optional_lite::optional<tinyusdz::Payload>::operator=(value,&local_150);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.prim_path._element._M_dataplus._M_p != paVar4) {
      operator_delete(local_150.prim_path._element._M_dataplus._M_p,
                      CONCAT71(local_150.prim_path._element.field_2._M_allocated_capacity._1_7_,
                               local_150.prim_path._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.prim_path._variant_part_str._M_dataplus._M_p != paVar3) {
      operator_delete(local_150.prim_path._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_150.prim_path._variant_part_str.field_2._M_allocated_capacity.
                               _1_7_,local_150.prim_path._variant_part_str.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.prim_path._variant_selection_part._M_dataplus._M_p != paVar2) {
      operator_delete(local_150.prim_path._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_150.prim_path._variant_selection_part.field_2.
                               _M_allocated_capacity._1_7_,
                               local_150.prim_path._variant_selection_part.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.prim_path._variant_part._M_dataplus._M_p != paVar1) {
      operator_delete(local_150.prim_path._variant_part._M_dataplus._M_p,
                      CONCAT71(local_150.prim_path._variant_part.field_2._M_allocated_capacity._1_7_
                               ,local_150.prim_path._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.prim_path._prop_part._M_dataplus._M_p !=
        &local_150.prim_path._prop_part.field_2) {
      operator_delete(local_150.prim_path._prop_part._M_dataplus._M_p,
                      CONCAT71(local_150.prim_path._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_150.prim_path._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.prim_path._prim_part._M_dataplus._M_p !=
        &local_150.prim_path._prim_part.field_2) {
      operator_delete(local_150.prim_path._prim_part._M_dataplus._M_p,
                      CONCAT71(local_150.prim_path._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_150.prim_path._prim_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.asset_path.resolved_path_._M_dataplus._M_p !=
        &local_150.asset_path.resolved_path_.field_2) {
      operator_delete(local_150.asset_path.resolved_path_._M_dataplus._M_p,
                      CONCAT71(local_150.asset_path.resolved_path_.field_2._M_allocated_capacity.
                               _1_7_,local_150.asset_path.resolved_path_.field_2._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.asset_path.asset_path_._M_dataplus._M_p !=
        &local_150.asset_path.asset_path_.field_2) {
      operator_delete(local_150.asset_path.asset_path_._M_dataplus._M_p,
                      CONCAT71(local_150.asset_path.asset_path_.field_2._M_allocated_capacity._1_7_,
                               local_150.asset_path.asset_path_.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar5;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<Payload> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  Payload v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}